

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_linpart.cpp
# Opt level: O1

Dist * Omega_h::copies_to_linear_owners
                 (Dist *__return_storage_ptr__,CommPtr *comm,Read<long> *globals)

{
  int *piVar1;
  Comm *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  Dist *this_01;
  I32 IVar4;
  I32 IVar5;
  long *plVar6;
  ulong total;
  Alloc *pAVar7;
  void *pvVar8;
  ScopedTimer omega_h_scoped_function_timer;
  Remotes copies2lins_map;
  string __str;
  ScopedTimer local_131;
  undefined1 local_130 [24];
  void *pvStack_118;
  Read<long> *local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  void *local_f8 [2];
  Alloc *local_e8;
  long local_e0;
  undefined1 local_d8 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  Read<long> local_b8;
  CommPtr local_a8;
  Read<long> local_98;
  CommPtr local_88;
  Remotes local_78;
  Dist *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_110 = globals;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_linpart.cpp"
             ,"");
  plVar6 = (long *)std::__cxx11::string::append((char *)local_50);
  pAVar7 = (Alloc *)(plVar6 + 2);
  if ((Alloc *)*plVar6 == pAVar7) {
    local_d8._0_8_ = pAVar7->size;
    local_d8._8_8_ = plVar6[3];
    local_e8 = (Alloc *)local_d8;
  }
  else {
    local_d8._0_8_ = pAVar7->size;
    local_e8 = (Alloc *)*plVar6;
  }
  local_e0 = plVar6[1];
  *plVar6 = (long)pAVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_108._M_allocated_capacity = (size_type)local_f8;
  std::__cxx11::string::_M_construct((ulong)&local_108,'\x02');
  *(undefined2 *)local_108._M_allocated_capacity = 0x3435;
  pvVar8 = (void *)0xf;
  if (local_e8 != (Alloc *)local_d8) {
    pvVar8 = (void *)local_d8._0_8_;
  }
  if (pvVar8 < (void *)(local_e0 + local_108._8_8_)) {
    pvVar8 = (void *)0xf;
    if ((void **)local_108._M_allocated_capacity != local_f8) {
      pvVar8 = local_f8[0];
    }
    if ((void *)(local_e0 + local_108._8_8_) <= pvVar8) {
      plVar6 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_108,0,(char *)0x0,(ulong)local_e8);
      goto LAB_002f74f5;
    }
  }
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_e8,local_108._M_allocated_capacity);
LAB_002f74f5:
  local_130._0_8_ = local_130 + 0x10;
  pAVar7 = (Alloc *)(plVar6 + 2);
  if ((Alloc *)*plVar6 == pAVar7) {
    local_130._16_8_ = pAVar7->size;
    pvStack_118 = (void *)plVar6[3];
  }
  else {
    local_130._16_8_ = pAVar7->size;
    local_130._0_8_ = (Alloc *)*plVar6;
  }
  local_130._8_8_ = plVar6[1];
  *plVar6 = (long)pAVar7;
  plVar6[1] = 0;
  *(undefined1 *)&pAVar7->size = 0;
  begin_code("copies_to_linear_owners",(char *)local_130._0_8_);
  if ((Alloc *)local_130._0_8_ != (Alloc *)(local_130 + 0x10)) {
    operator_delete((void *)local_130._0_8_,(ulong)((long)(size_t *)local_130._16_8_ + 1));
  }
  if ((void **)local_108._M_allocated_capacity != local_f8) {
    operator_delete((void *)local_108._M_allocated_capacity,(long)local_f8[0] + 1);
  }
  if (local_e8 != (Alloc *)local_d8) {
    operator_delete(local_e8,local_d8._0_8_ + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_88.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_88.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_88.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_88.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_88.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_88.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_88.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_98.write_.shared_alloc_.alloc = (local_110->write_).shared_alloc_.alloc;
  if (((ulong)local_98.write_.shared_alloc_.alloc & 7) == 0 &&
      local_98.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98.write_.shared_alloc_.alloc =
           (Alloc *)((local_98.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_98.write_.shared_alloc_.alloc)->use_count =
           (local_98.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_98.write_.shared_alloc_.direct_ptr = (local_110->write_).shared_alloc_.direct_ptr;
  total = find_total_globals(&local_88,&local_98);
  pAVar7 = local_98.write_.shared_alloc_.alloc;
  if (((ulong)local_98.write_.shared_alloc_.alloc & 7) == 0 &&
      local_98.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_98.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_98.write_.shared_alloc_.alloc);
      operator_delete(pAVar7,0x48);
    }
  }
  if (local_88.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  this = (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_58 = __return_storage_ptr__;
  IVar4 = Comm::size(this);
  IVar5 = Comm::rank(this);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = total;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  local_a8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_a8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_a8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_a8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_a8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_a8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_a8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_b8.write_.shared_alloc_.alloc = (local_110->write_).shared_alloc_.alloc;
  if (((ulong)local_b8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b8.write_.shared_alloc_.alloc =
           (Alloc *)((local_b8.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_b8.write_.shared_alloc_.alloc)->use_count =
           (local_b8.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_b8.write_.shared_alloc_.direct_ptr = (local_110->write_).shared_alloc_.direct_ptr;
  globals_to_linear_owners((Remotes *)local_130,&local_a8,&local_b8,total);
  pAVar7 = local_b8.write_.shared_alloc_.alloc;
  if (((ulong)local_b8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_b8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_b8.write_.shared_alloc_.alloc);
      operator_delete(pAVar7,0x48);
    }
  }
  if (local_a8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  this_01 = local_58;
  local_d8._16_8_ = (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_c0 = (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_c0->_M_use_count = local_c0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_c0->_M_use_count = local_c0->_M_use_count + 1;
    }
  }
  local_78.ranks.write_.shared_alloc_.alloc = (Alloc *)local_130._0_8_;
  if ((local_130._0_8_ & 7) == 0 && (Alloc *)local_130._0_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_78.ranks.write_.shared_alloc_.alloc = (Alloc *)(*(size_t *)local_130._0_8_ * 8 + 1);
    }
    else {
      *(int *)(local_130._0_8_ + 0x30) = *(int *)(local_130._0_8_ + 0x30) + 1;
    }
  }
  local_78.ranks.write_.shared_alloc_.direct_ptr = (void *)local_130._8_8_;
  local_78.idxs.write_.shared_alloc_.alloc = (Alloc *)local_130._16_8_;
  if ((local_130._16_8_ & 7) == 0 && (Alloc *)local_130._16_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_78.idxs.write_.shared_alloc_.alloc = (Alloc *)(*(size_t *)local_130._16_8_ * 8 + 1);
    }
    else {
      *(int *)(local_130._16_8_ + 0x30) = *(int *)(local_130._16_8_ + 0x30) + 1;
    }
  }
  local_78.idxs.write_.shared_alloc_.direct_ptr = pvStack_118;
  Dist::Dist(this_01,(CommPtr *)(local_d8 + 0x10),&local_78,
             (uint)(IVar5 < SUB164(auVar2 % SEXT816((long)IVar4),0)) +
             SUB164(auVar2 / SEXT816((long)IVar4),0));
  pAVar7 = local_78.idxs.write_.shared_alloc_.alloc;
  if (((ulong)local_78.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
      local_78.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_78.idxs.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_78.idxs.write_.shared_alloc_.alloc);
      operator_delete(pAVar7,0x48);
    }
  }
  pAVar7 = local_78.ranks.write_.shared_alloc_.alloc;
  if (((ulong)local_78.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
      local_78.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_78.ranks.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar7);
      operator_delete(pAVar7,0x48);
    }
  }
  if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
  }
  uVar3 = local_130._16_8_;
  if ((local_130._16_8_ & 7) == 0 && (Alloc *)local_130._16_8_ != (Alloc *)0x0) {
    piVar1 = (int *)(local_130._16_8_ + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_130._16_8_);
      operator_delete((void *)uVar3,0x48);
    }
  }
  uVar3 = local_130._0_8_;
  if ((local_130._0_8_ & 7) == 0 && (Alloc *)local_130._0_8_ != (Alloc *)0x0) {
    piVar1 = (int *)(local_130._0_8_ + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_130._0_8_);
      operator_delete((void *)uVar3,0x48);
    }
  }
  ScopedTimer::~ScopedTimer(&local_131);
  return this_01;
}

Assistant:

Dist copies_to_linear_owners(CommPtr comm, Read<GO> globals) {
  OMEGA_H_TIME_FUNCTION;
  auto const total = find_total_globals(comm, globals);
  auto const nlins = linear_partition_size(comm, total);
  auto const copies2lins_map = globals_to_linear_owners(comm, globals, total);
  auto const copies2lins_dist = Dist(comm, copies2lins_map, nlins);
  return copies2lins_dist;
}